

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer3.cpp
# Opt level: O2

int main(void)

{
  thread consThr;
  thread prodThr;
  Consumer cons;
  Producer prod;
  Queue<int> q;
  reference_wrapper<Producer> local_108;
  thread local_100;
  Consumer local_f8;
  reference_wrapper<Consumer> local_f0;
  Producer local_e8;
  Queue<int> local_d8;
  
  rtb::Concurrency::Queue<int>::Queue(&local_d8);
  local_108._M_data = &local_e8;
  local_e8.numberOfMessages_ = 10;
  local_f8.inputQueue_ = &local_d8;
  local_e8.outputQueue_ = &local_d8;
  std::thread::thread<std::reference_wrapper<Producer>,,void>(&local_100,&local_108);
  local_f0._M_data = &local_f8;
  std::thread::thread<std::reference_wrapper<Consumer>,,void>((thread *)&local_108,&local_f0);
  std::thread::join();
  std::thread::join();
  std::thread::~thread((thread *)&local_108);
  std::thread::~thread(&local_100);
  rtb::Concurrency::Queue<int>::~Queue(&local_d8);
  return 0;
}

Assistant:

int main() {
    // Define the queue as a variable in the main scope
    Queue<int> q;

    Producer prod(10, q);
    Consumer cons(q);

    // Run `produce` function on a new thread providing a function argument
    std::thread prodThr(std::ref(prod));
    // Run `consume` function on a new thread
    std::thread consThr(std::ref(cons));

    // Wait for the threads to terminate before exiting the main function
    prodThr.join();
    consThr.join();

    return 0;
}